

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
* ear::extraPosVerticalNominal
            (pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
             *__return_storage_ptr__,Layout *layout)

{
  pointer pCVar1;
  PolarPosition polarPosition;
  double dVar2;
  pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *ppVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *pvVar6;
  long lVar7;
  string *psVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  Scalar *pSVar10;
  Channel *channel;
  pointer pCVar11;
  undefined1 auVar12 [16];
  double layerNominalElevation;
  VectorXd downmixRow;
  MatrixXd downmix;
  vector<ear::Channel,_std::allocator<ear::Channel>_> extraChannels;
  double layerUpperBound;
  double layerLowerBound;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  Layout currentLayerLayout;
  Layout midLayerLayout;
  double local_400;
  allocator<char> local_3e9;
  double local_3e8;
  undefined8 uStack_3e0;
  double local_3d0;
  PolarPosition local_3c8;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_3b0;
  optional<ear::PolarPosition> local_398;
  vector<ear::Channel,_std::allocator<ear::Channel>_> local_378;
  pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *local_358;
  long local_350;
  optional<std::pair<double,_double>_> local_348;
  optional<std::pair<double,_double>_> local_330;
  double local_318;
  double local_310;
  vector<ear::Channel,_std::allocator<ear::Channel>_> local_308;
  void *local_2f0;
  double dStack_2e8;
  double local_2e0;
  string local_2d8;
  vector<ear::Channel,_std::allocator<ear::Channel>_> local_2b8;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288 [8];
  PolarPosition local_208;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  string local_1d8;
  string local_1b8;
  Layout local_198;
  PolarPosition local_128;
  optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> local_110;
  Layout local_d8;
  optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> local_68;
  
  local_378.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar6 = Layout::channels(layout);
  pCVar11 = (pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar1 = (pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar6 = Layout::channels(layout);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            ((IdentityReturnType *)local_298,((long)pCVar1 - (long)pCVar11) / 0x90,
             ((long)(pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl
                   .super__Vector_impl_data._M_start) / 0x90);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_3b0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"",(allocator<char> *)&local_198);
  local_308.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getDefaultScreen();
  boost::optional_detail::optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::
  optional_base(&local_110,local_298);
  Layout::Layout(&local_d8,&local_1b8,&local_308,
                 (optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> *)&local_110);
  local_358 = __return_storage_ptr__;
  boost::optional_detail::optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::
  ~optional_base(&local_110);
  boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
            ((variant<ear::PolarScreen,_ear::CartesianScreen> *)local_298);
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_308);
  std::__cxx11::string::~string((string *)&local_1b8);
  pvVar6 = Layout::channels(layout);
  pCVar11 = (pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pvVar6 = Layout::channels(layout);
  pCVar1 = (pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar6 = Layout::channels(&local_d8);
  for (; pCVar11 != pCVar1; pCVar11 = pCVar11 + 1) {
    Channel::Channel((Channel *)local_298,pCVar11);
    Channel::polarPositionNominal((PolarPosition *)&local_198,(Channel *)local_298);
    if (-10.0 <= (double)local_198._name._M_string_length) {
      Channel::polarPositionNominal(&local_208,(Channel *)local_298);
      local_3e8 = local_208.elevation;
      Channel::~Channel((Channel *)local_298);
      if (local_3e8 <= 10.0) {
        std::vector<ear::Channel,_std::allocator<ear::Channel>_>::push_back(pvVar6,pCVar11);
      }
    }
    else {
      Channel::~Channel((Channel *)local_298);
    }
  }
  local_208.azimuth = -10.0;
  local_208.elevation = -70.0;
  local_208.distance = -30.0;
  uStack_1f0 = 0x4051800000000000;
  local_1e8 = 0x4024000000000000;
  uStack_1e0 = 0x403e000000000000;
  lVar7 = 0;
  while (ppVar3 = local_358, lVar7 != 0x30) {
    local_298._0_8_ = &local_318;
    local_298._8_8_ = &local_310;
    local_288[0]._0_8_ = &local_3d0;
    local_350 = lVar7;
    std::tuple<double&,double&,double&>::operator=
              ((tuple<double&,double&,double&> *)local_298,
               (tuple<double,_double,_double> *)((long)&local_208.azimuth + lVar7));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"",(allocator<char> *)&local_2d8);
    local_2b8.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    getDefaultScreen();
    boost::optional_detail::optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::
    optional_base(&local_68,(Channel *)local_298);
    Layout::Layout(&local_198,&local_1d8,&local_2b8,
                   (optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> *)&local_68);
    boost::optional_detail::optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::
    ~optional_base(&local_68);
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)local_298);
    std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_2b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    pvVar6 = Layout::channels(layout);
    pCVar11 = (pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pvVar6 = Layout::channels(layout);
    pCVar1 = (pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pvVar6 = Layout::channels(&local_198);
    for (; pCVar11 != pCVar1; pCVar11 = pCVar11 + 1) {
      Channel::Channel((Channel *)local_298,pCVar11);
      local_3e8 = local_310;
      Channel::polarPositionNominal((PolarPosition *)&local_2d8,(Channel *)local_298);
      if (local_3e8 <= (double)local_2d8._M_string_length) {
        Channel::polarPositionNominal(&local_3c8,(Channel *)local_298);
        dVar2 = local_3c8.elevation;
        local_3e8 = local_318;
        Channel::~Channel((Channel *)local_298);
        if (dVar2 <= local_3e8) {
          std::vector<ear::Channel,_std::allocator<ear::Channel>_>::push_back(pvVar6,pCVar11);
        }
      }
      else {
        Channel::~Channel((Channel *)local_298);
      }
    }
    pvVar6 = Layout::channels(&local_198);
    if ((pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
        super__Vector_impl_data._M_finish ==
        (pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      local_400 = local_3d0;
      local_3e8 = -1e-05;
      uStack_3e0 = 0;
    }
    else {
      pvVar6 = Layout::channels(&local_198);
      pCVar11 = (pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pCVar1 = (pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_3e8 = 2.2250738585072014e-308;
      uStack_3e0 = 0;
      for (; pCVar11 != pCVar1; pCVar11 = pCVar11 + 1) {
        Channel::polarPositionNominal((PolarPosition *)local_298,pCVar11);
        if (local_3e8 < ABS((double)local_298._0_8_)) {
          Channel::polarPositionNominal((PolarPosition *)local_298,pCVar11);
          local_3e8 = ABS((double)local_298._0_8_);
          uStack_3e0 = 0;
        }
      }
      local_3e8 = local_3e8 + 40.0;
      pvVar6 = Layout::channels(&local_198);
      pCVar11 = (pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pvVar6 = Layout::channels(&local_198);
      pCVar1 = (pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_400 = 0.0;
      for (; pCVar11 != pCVar1; pCVar11 = pCVar11 + 1) {
        Channel::polarPosition(pCVar11);
        local_400 = local_400 + (double)local_298._8_8_;
      }
      pvVar6 = Layout::channels(&local_198);
      lVar7 = ((long)(pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>).
                    _M_impl.super__Vector_impl_data._M_start) / 0x90;
      auVar12._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar12._0_8_ = lVar7;
      auVar12._12_4_ = 0x45300000;
      local_400 = local_400 /
                  ((auVar12._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
      local_3e8 = local_3e8 + -1e-05;
    }
    pvVar6 = Layout::channels(&local_d8);
    pCVar1 = (pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar11 = (pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl
                   .super__Vector_impl_data._M_start; pCVar11 != pCVar1; pCVar11 = pCVar11 + 1) {
      Channel::polarPosition(pCVar11);
      if (local_3e8 <= ABS((double)local_298._0_8_)) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"extra",&local_3e9);
        Channel::polarPosition(pCVar11);
        local_2f0 = (void *)local_3c8.azimuth;
        dStack_2e8 = local_400;
        local_2e0 = 1.0;
        Channel::polarPositionNominal(&local_128,pCVar11);
        local_398.super_type.m_storage.dummy_.aligner_ = (type)local_128.azimuth;
        local_398.super_type.m_storage.dummy_._8_8_ = local_3d0;
        local_398.super_type.m_storage.dummy_._16_8_ = 0x3ff0000000000000;
        local_398.super_type.m_initialized = true;
        local_330.super_type.m_initialized = false;
        local_348.super_type.m_initialized = false;
        polarPosition.elevation = dStack_2e8;
        polarPosition.azimuth = (double)local_2f0;
        polarPosition.distance = local_2e0;
        Channel::Channel((Channel *)local_298,&local_2d8,polarPosition,&local_398,&local_330,
                         &local_348,false);
        std::vector<ear::Channel,_std::allocator<ear::Channel>_>::emplace_back<ear::Channel>
                  (&local_378,(Channel *)local_298);
        Channel::~Channel((Channel *)local_298);
        if (local_348.super_type.m_initialized == true) {
          local_348.super_type.m_initialized = false;
        }
        if (local_330.super_type.m_initialized == true) {
          local_330.super_type.m_initialized = false;
        }
        if (local_398.super_type.m_initialized == true) {
          local_398.super_type.m_initialized = false;
        }
        std::__cxx11::string::~string((string *)&local_2d8);
        pvVar6 = Layout::channels(layout);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
                  ((ConstantReturnType *)local_298,
                   ((long)(pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar6->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>).
                         _M_impl.super__Vector_impl_data._M_start) / 0x90);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_3c8,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_298);
        Layout::channelNames_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_2d8,layout);
        sVar5 = local_2d8._M_string_length;
        _Var4._M_p = local_2d8._M_dataplus._M_p;
        psVar8 = Channel::name_abi_cxx11_(pCVar11);
        _Var9 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (_Var4._M_p,sVar5,psVar8);
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                             &local_3c8,
                             (long)(int)((ulong)((long)_Var9._M_current - (long)_Var4._M_p) >> 5));
        *pSVar10 = 1.0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
                  (&local_3b0,local_3b0.m_storage.m_rows + 1,NoChange);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_298,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_3b0,local_3b0.m_storage.m_rows + -1);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_298,
                   (Matrix<double,__1,_1,_0,__1,_1> *)&local_3c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_2d8);
        free((void *)local_3c8.azimuth);
      }
    }
    Layout::~Layout(&local_198);
    lVar7 = local_350 + 0x18;
  }
  std::
  pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::
  pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_true>
            (local_358,&local_378,(Matrix<double,__1,__1,_0,__1,__1> *)&local_3b0);
  Layout::~Layout(&local_d8);
  free(local_3b0.m_storage.m_data);
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_378);
  return ppVar3;
}

Assistant:

std::pair<std::vector<Channel>, Eigen::MatrixXd> extraPosVerticalNominal(
      Layout layout) {
    std::vector<Channel> extraChannels;
    Eigen::MatrixXd downmix = Eigen::MatrixXd::Identity(
        layout.channels().size(), layout.channels().size());

    Layout midLayerLayout;
    std::copy_if(layout.channels().begin(), layout.channels().end(),
                 std::back_inserter(midLayerLayout.channels()), [](Channel c) {
                   return -10 <= c.polarPositionNominal().elevation &&
                          c.polarPositionNominal().elevation <= 10;
                 });

    auto layers = {std::make_tuple(-30.0, -70.0, -10.0),
                   std::make_tuple(30.0, 10.0, 70.0)};

    double layerNominalElevation, layerLowerBound, layerUpperBound;
    for (const auto& layer : layers) {
      std::tie(layerNominalElevation, layerLowerBound, layerUpperBound) = layer;

      Layout currentLayerLayout;
      std::copy_if(
          layout.channels().begin(), layout.channels().end(),
          std::back_inserter(currentLayerLayout.channels()), [&](Channel c) {
            return layerLowerBound <= c.polarPositionNominal().elevation &&
                   c.polarPositionNominal().elevation <= layerUpperBound;
          });

      // for each loudspeaker in the mid layer that has an azimuth greater
      // than az_limit, add a virtual speaker directly above/below it at the
      // elevation of the current layer, which is downmixed directly to the
      // mid layer loudspeaker. az_limit is set to the range of azimuths in
      // the current layer, with some space added to prevent fast vertical
      // source movements when sources move horizontally. If there are no
      // channels on this layer then a copy of all mid layer speakers is
      // made.
      double azimuthLimit = 0.0;
      double layerRealElevation = 0.0;
      if (currentLayerLayout.channels().size() != 0) {
        double azimuthRange = std::numeric_limits<double>::min();
        for (const auto& channel : currentLayerLayout.channels()) {
          if (azimuthRange < std::abs(channel.polarPositionNominal().azimuth)) {
            azimuthRange = std::abs(channel.polarPositionNominal().azimuth);
          }
        }
        azimuthLimit = azimuthRange + 40.0;
        layerRealElevation =
            std::accumulate(currentLayerLayout.channels().begin(),
                            currentLayerLayout.channels().end(), 0.0,
                            [&](double sum, const Channel& c) -> double {
                              return sum + c.polarPosition().elevation;
                            }) /
            static_cast<double>(currentLayerLayout.channels().size());
      } else {
        layerRealElevation = layerNominalElevation;
      }

      double epsilon = 1e-5;
      for (const auto& midChannel : midLayerLayout.channels()) {
        if (std::abs(midChannel.polarPosition().azimuth) >=
            azimuthLimit - epsilon) {
          extraChannels.push_back(Channel(
              "extra",
              PolarPosition(midChannel.polarPosition().azimuth,
                            layerRealElevation, 1.0),
              PolarPosition(midChannel.polarPositionNominal().azimuth,
                            layerNominalElevation, 1.0)

                  ));
          Eigen::VectorXd downmixRow =
              Eigen::VectorXd::Zero(layout.channels().size());
          auto names = layout.channelNames();
          int midChannelIndex = static_cast<int>(std::distance(
              names.begin(),
              std::find(names.begin(), names.end(), midChannel.name())));
          downmixRow(midChannelIndex) = 1.0;
          downmix.conservativeResize(downmix.rows() + 1, Eigen::NoChange);
          downmix.row(downmix.rows() - 1) = downmixRow;
        }
      }
    }
    return std::make_pair(extraChannels, downmix);
  }